

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_32f82::Boid::annotateAvoidObstacle(Boid *this,float minDistanceToCollision)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float in_XMM1_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Color white;
  Vec3 local_80;
  Vec3 local_70;
  Vec3 local_60;
  Vec3 local_50;
  Color local_40;
  
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[2])();
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x18])(this);
  in_XMM1_Da = in_XMM1_Da * extraout_XMM0_Da_00;
  fVar1 = extraout_XMM0_Da_00;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[6])(this);
  fVar1 = fVar1 * minDistanceToCollision;
  fVar2 = fVar1;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  fVar3 = extraout_XMM0_Da_00 * extraout_XMM0_Da;
  fVar4 = extraout_XMM0_Da_00 * extraout_XMM0_Db;
  fVar2 = (fVar2 + fVar1) - in_XMM1_Da;
  local_50.y = (extraout_XMM0_Db_01 + minDistanceToCollision * extraout_XMM0_Db_00) - fVar4;
  local_50.x = (extraout_XMM0_Da_02 + minDistanceToCollision * extraout_XMM0_Da_01) - fVar3;
  local_50.z = fVar2;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  fVar1 = fVar2 + fVar1 + in_XMM1_Da;
  local_60.y = extraout_XMM0_Db_02 + minDistanceToCollision * extraout_XMM0_Db_00 + fVar4;
  local_60.x = extraout_XMM0_Da_03 + minDistanceToCollision * extraout_XMM0_Da_01 + fVar3;
  local_60.z = fVar1;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  fVar1 = fVar1 - in_XMM1_Da;
  local_70.y = extraout_XMM0_Db_03 - fVar4;
  local_70.x = extraout_XMM0_Da_04 - fVar3;
  local_70.z = fVar1;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  local_80.z = fVar1 + in_XMM1_Da;
  local_80.y = extraout_XMM0_Db_04 + fVar4;
  local_80.x = extraout_XMM0_Da_05 + fVar3;
  OpenSteer::Color::Color(&local_40,1.0,1.0,1.0,1.0);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_50,&local_60,&local_40);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_60,&local_80,&local_40);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_80,&local_70,&local_40);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_70,&local_50,&local_40);
  return;
}

Assistant:

void annotateAvoidObstacle (const float minDistanceToCollision)
        {
            const Vec3 boxSide = side() * radius();
            const Vec3 boxFront = forward() * minDistanceToCollision;
            const Vec3 FR = position() + boxFront - boxSide;
            const Vec3 FL = position() + boxFront + boxSide;
            const Vec3 BR = position()            - boxSide;
            const Vec3 BL = position()            + boxSide;
            const Color white (1,1,1);
            annotationLine (FR, FL, white);
            annotationLine (FL, BL, white);
            annotationLine (BL, BR, white);
            annotationLine (BR, FR, white);
        }